

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool mz_zip_reader_extract_file_to_mem_no_alloc
                  (mz_zip_archive *pZip,char *pFilename,void *pBuf,size_t buf_size,mz_uint flags,
                  void *pUser_read_buf,size_t user_read_buf_size)

{
  int iVar1;
  int file_index;
  undefined4 in_stack_00000018;
  void *in_stack_00002da0;
  mz_uint in_stack_00002dac;
  size_t in_stack_00002db0;
  void *in_stack_00002db8;
  mz_uint in_stack_00002dc4;
  mz_zip_archive *in_stack_00002dc8;
  size_t in_stack_00002de0;
  undefined4 local_4;
  
  iVar1 = mz_zip_reader_locate_file
                    ((mz_zip_archive *)pBuf,(char *)buf_size,
                     (char *)CONCAT44(flags,in_stack_00000018),pUser_read_buf._4_4_);
  if (iVar1 < 0) {
    local_4 = 0;
  }
  else {
    local_4 = mz_zip_reader_extract_to_mem_no_alloc
                        (in_stack_00002dc8,in_stack_00002dc4,in_stack_00002db8,in_stack_00002db0,
                         in_stack_00002dac,in_stack_00002da0,in_stack_00002de0);
  }
  return local_4;
}

Assistant:

mz_bool mz_zip_reader_extract_file_to_mem_no_alloc(
    mz_zip_archive *pZip, const char *pFilename, void *pBuf, size_t buf_size,
    mz_uint flags, void *pUser_read_buf, size_t user_read_buf_size) {
  int file_index = mz_zip_reader_locate_file(pZip, pFilename, NULL, flags);
  if (file_index < 0)
    return MZ_FALSE;
  return mz_zip_reader_extract_to_mem_no_alloc(pZip, file_index, pBuf, buf_size,
                                               flags, pUser_read_buf,
                                               user_read_buf_size);
}